

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

deque<int,_std::allocator<int>_> * __thiscall
VertexClustering::sortNeighbor
          (deque<int,_std::allocator<int>_> *__return_storage_ptr__,VertexClustering *this,
          set<int,_std::less<int>,_std::allocator<int>_> *ring)

{
  _Rb_tree_color *p_Var1;
  bool bVar2;
  bool bVar3;
  _Elt_pointer piVar4;
  _Rb_tree_node_base *p_Var5;
  bool bVar6;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar7;
  int n;
  int first;
  set<int,_std::less<int>,_std::allocator<int>_> unsorted;
  _Rb_tree_color local_68;
  _Rb_tree_color local_64;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_60,&ring->_M_t);
  local_64 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
  pVar7 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          equal_range(&local_60,(key_type *)&local_64);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&local_60,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            (&__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>,0);
  p_Var1 = (_Rb_tree_color *)
           (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (p_Var1 == (_Rb_tree_color *)
                ((__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_last + -1)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)__return_storage_ptr__,(int *)&local_64);
  }
  else {
    *p_Var1 = local_64;
    (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
    super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)(p_Var1 + 1);
  }
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      bVar6 = false;
      for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        local_68 = p_Var5[1]._M_color;
        bVar2 = Vertex::hasNeighborVertex
                          ((Vertex *)
                           (&this->vGroupNew->field_0x0 +
                           (long)*(__return_storage_ptr__->
                                  super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Deque_impl_data._M_start._M_cur * 0x50),local_68);
        if (bVar2) {
          piVar4 = (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          if (piVar4 == (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_first) {
            std::deque<int,std::allocator<int>>::_M_push_front_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)__return_storage_ptr__,(int *)&local_68);
          }
          else {
            piVar4[-1] = local_68;
            (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur = piVar4 + -1;
          }
LAB_00117133:
          pVar7 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::equal_range(&local_60,(key_type *)&local_68);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_erase_aux(&local_60,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
          bVar6 = true;
          bVar2 = false;
        }
        else {
          piVar4 = (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (piVar4 == (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>).
                        _M_impl.super__Deque_impl_data._M_finish._M_first) {
            piVar4 = (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
          }
          bVar3 = Vertex::hasNeighborVertex
                            ((Vertex *)(&this->vGroupNew->field_0x0 + (long)piVar4[-1] * 0x50),
                             local_68);
          bVar2 = true;
          if (bVar3) {
            p_Var1 = (_Rb_tree_color *)
                     (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
            if (p_Var1 == (_Rb_tree_color *)
                          ((__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)__return_storage_ptr__,(int *)&local_68);
            }
            else {
              *p_Var1 = local_68;
              (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)(p_Var1 + 1);
            }
            goto LAB_00117133;
          }
        }
        if (!bVar2) break;
      }
    } while ((bVar6) && (local_60._M_impl.super__Rb_tree_header._M_node_count != 0));
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

deque<int> VertexClustering::sortNeighbor(const set<int>& ring) {
	set<int> unsorted(ring);
	int first = *(unsorted.begin());
	unsorted.erase(first);
	deque<int> q;
	q.push_back(first);
	while (!unsorted.empty()) {
		bool modified = false;
		for (int n : unsorted) {
			if (vGroupNew->group[q.front()].hasNeighborVertex(n)) {
				q.push_front(n);
				unsorted.erase(n);
				modified = true;
				break;
			}
			if (vGroupNew->group[q.back()].hasNeighborVertex(n)) {
				q.push_back(n);
				unsorted.erase(n);
				modified = true;
				break;
			}
		}
		if (!modified)
			break;
	}
	return q;
}